

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_true>::insert_block_link_
          (DaTrie<true,_false,_true> *this,uint32_t block_pos,
          vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *blocks)

{
  uint uVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pvVar4;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *in_RDX;
  uint in_ESI;
  long in_RDI;
  uint32_t tail_pos;
  
  sVar3 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::size(in_RDX);
  if (in_ESI < sVar3) {
    if (*(int *)(in_RDI + 0x60) == -1) {
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)in_ESI);
      pvVar4->next = in_ESI;
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)in_ESI);
      pvVar4->prev = in_ESI;
      *(uint *)(in_RDI + 0x60) = in_ESI;
    }
    else {
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)*(uint *)(in_RDI + 0x60));
      uVar1 = pvVar4->prev;
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)in_ESI);
      pvVar4->prev = uVar1;
      uVar2 = *(uint32_t *)(in_RDI + 0x60);
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)in_ESI);
      pvVar4->next = uVar2;
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)uVar1);
      pvVar4->next = in_ESI;
      pvVar4 = std::vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_>::operator[]
                         (in_RDX,(ulong)*(uint *)(in_RDI + 0x60));
      pvVar4->prev = in_ESI;
    }
    return;
  }
  __assert_fail("block_pos < blocks.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x4e6,
                "void ddd::DaTrie<true, false, true>::insert_block_link_(uint32_t, std::vector<BlockLink> &) [WithBLM = true, WithNLM = false, Prefix = true]"
               );
}

Assistant:

void insert_block_link_(uint32_t block_pos, std::vector<BlockLink>& blocks) {
    assert(block_pos < blocks.size());

    if (head_pos_ != NOT_FOUND) {
      auto tail_pos = blocks[head_pos_].prev;
      blocks[block_pos].prev = tail_pos;
      blocks[block_pos].next = head_pos_;
      blocks[tail_pos].next = block_pos;
      blocks[head_pos_].prev = block_pos;
    } else {
      blocks[block_pos].next = block_pos;
      blocks[block_pos].prev = block_pos;
      head_pos_ = block_pos;
    }
  }